

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_version_manager.cpp
# Opt level: O3

idx_t __thiscall
duckdb::RowVersionManager::GetCommittedDeletedCount(RowVersionManager *this,idx_t count)

{
  int iVar1;
  reference pvVar2;
  pointer pCVar3;
  undefined4 extraout_var;
  ulong uVar4;
  ulong uVar5;
  ulong __n;
  idx_t iVar6;
  idx_t local_40;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 != 0) {
    ::std::__throw_system_error(iVar1);
  }
  if (count == 0) {
    local_40 = 0;
  }
  else {
    local_40 = 0;
    __n = 0;
    uVar5 = 0;
    iVar6 = count;
    do {
      if ((__n < (ulong)((long)(this->vector_info).
                               super_vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->vector_info).
                               super_vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3)) &&
         (pvVar2 = vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
                   ::operator[](&this->vector_info,__n),
         (pvVar2->super_unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>)._M_t
         .super___uniq_ptr_impl<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::ChunkInfo_*,_std::default_delete<duckdb::ChunkInfo>_>.
         super__Head_base<0UL,_duckdb::ChunkInfo_*,_false>._M_head_impl != (ChunkInfo *)0x0)) {
        uVar4 = 0x800;
        if (iVar6 < 0x800) {
          uVar4 = iVar6;
        }
        pvVar2 = vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
                 ::operator[](&this->vector_info,__n);
        pCVar3 = unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>::
                 operator->(pvVar2);
        iVar1 = (*pCVar3->_vptr_ChunkInfo[6])(pCVar3,uVar4);
        local_40 = local_40 + CONCAT44(extraout_var,iVar1);
      }
      uVar5 = uVar5 + 0x800;
      __n = __n + 1;
      iVar6 = iVar6 - 0x800;
    } while (uVar5 < count);
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return local_40;
}

Assistant:

idx_t RowVersionManager::GetCommittedDeletedCount(idx_t count) {
	lock_guard<mutex> l(version_lock);
	idx_t deleted_count = 0;
	for (idx_t r = 0, i = 0; r < count; r += STANDARD_VECTOR_SIZE, i++) {
		if (i >= vector_info.size() || !vector_info[i]) {
			continue;
		}
		idx_t max_count = MinValue<idx_t>(STANDARD_VECTOR_SIZE, count - r);
		if (max_count == 0) {
			break;
		}
		deleted_count += vector_info[i]->GetCommittedDeletedCount(max_count);
	}
	return deleted_count;
}